

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xinclude(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  xmlDocPtr pxVar7;
  xmlDocPtr pxVar8;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int *piVar9;
  xmlDocPtr in_RSI;
  ulong uVar10;
  int test_ret_2;
  bool bVar11;
  int n_doc;
  uint uVar12;
  int local_54;
  int local_50;
  int test_ret_1;
  int local_48;
  int test_ret;
  int local_40;
  int local_3c;
  
  if (quiet == '\0') {
    puts("Testing xinclude : 9 of 13 functions ...");
  }
  bVar11 = true;
  iVar3 = 0;
  while (bVar11) {
    iVar1 = xmlMemBlocks();
    xmlXIncludeGetLastError(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar11 = false;
    printf("Leak of %d blocks found in xmlXIncludeGetLastError");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + -1;
  }
  function_tests = function_tests + 1;
  local_50 = 0;
  for (uVar12 = 0; uVar12 != 4; uVar12 = uVar12 + 1) {
    iVar1 = xmlMemBlocks();
    pxVar7 = gen_xmlDocPtr(uVar12,(int)in_RSI);
    xmlXIncludeProcess(pxVar7);
    call_tests = call_tests + 1;
    des_xmlDocPtr((int)pxVar7,in_RSI,nr);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeProcess",(ulong)(uint)(iVar2 - iVar1));
      local_50 = local_50 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar12;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar12 = 0; uVar12 != 4; uVar12 = uVar12 + 1) {
    pxVar7 = (xmlDocPtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar7;
      if (iVar2 == 4) break;
      iVar4 = xmlMemBlocks();
      pxVar8 = gen_xmlDocPtr(uVar12,iVar1);
      uVar5 = gen_int(iVar2,iVar1);
      in_RSI = (xmlDocPtr)(ulong)uVar5;
      xmlXIncludeProcessFlags(pxVar8);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar8,in_RSI,nr_00);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar4 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeProcessFlags",(ulong)(uint)(iVar1 - iVar4));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar7;
      }
      pxVar7 = (xmlDocPtr)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  for (uVar12 = 0; uVar12 != 4; uVar12 = uVar12 + 1) {
    uVar10 = 0;
    while (iVar1 = (int)uVar10, iVar1 != 4) {
      pxVar7 = (xmlDocPtr)0x0;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar4 = (int)pxVar7;
        if (iVar4 == 3) break;
        iVar6 = xmlMemBlocks();
        pxVar8 = gen_xmlDocPtr(uVar12,iVar2);
        uVar5 = gen_int(iVar1,iVar2);
        piVar9 = &call_tests;
        if (iVar4 != 0) {
          if (iVar4 == 1) {
            piVar9 = (int *)0xffffffffffffffff;
          }
          else {
            piVar9 = (int *)0x0;
          }
        }
        in_RSI = (xmlDocPtr)(ulong)uVar5;
        xmlXIncludeProcessFlagsData(pxVar8,in_RSI,piVar9);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar8,in_RSI,nr_01);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar6 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXIncludeProcessFlagsData",
                 (ulong)(uint)(iVar2 - iVar6));
          local_3c = local_3c + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar7;
        }
        pxVar7 = (xmlDocPtr)(ulong)(iVar4 + 1);
      }
      uVar10 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar11 = true;
  local_48 = 0;
  while (bVar11) {
    for (uVar12 = 0; iVar1 = (int)in_RSI, uVar12 != 3; uVar12 = uVar12 + 1) {
      iVar2 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar12,iVar1);
      xmlXIncludeProcessNode(0,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,(xmlNodePtr)in_RSI,nr_02);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar2 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeProcessNode",(ulong)(uint)(iVar1 - iVar2));
        local_48 = local_48 + 1;
        printf(" %d",0);
        in_RSI = (xmlDocPtr)(ulong)uVar12;
        printf(" %d");
        putchar(10);
      }
    }
    bVar11 = false;
  }
  function_tests = function_tests + 1;
  local_54 = 0;
  for (uVar12 = 0; iVar1 = (int)in_RSI, uVar12 != 3; uVar12 = uVar12 + 1) {
    iVar2 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar12,iVar1);
    xmlXIncludeProcessTree(in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar12,(xmlNodePtr)in_RSI,nr_03);
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar2 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeProcessTree",(ulong)(uint)(iVar1 - iVar2));
      local_54 = local_54 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar12;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (uVar12 = 0; uVar12 != 3; uVar12 = uVar12 + 1) {
    pxVar7 = (xmlDocPtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar7;
      if (iVar2 == 4) break;
      iVar4 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar12,iVar1);
      iVar1 = gen_int(iVar2,iVar1);
      xmlXIncludeProcessTreeFlags(in_RSI,iVar1);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,(xmlNodePtr)in_RSI,nr_04);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar4 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeProcessTreeFlags",(ulong)(uint)(iVar1 - iVar4)
              );
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar7;
      }
      pxVar7 = (xmlDocPtr)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_40 = 0;
  for (uVar12 = 0; uVar12 != 3; uVar12 = uVar12 + 1) {
    uVar10 = 0;
    while (iVar1 = (int)uVar10, iVar1 != 4) {
      pxVar7 = (xmlDocPtr)0x0;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar4 = (int)pxVar7;
        if (iVar4 == 3) break;
        iVar6 = xmlMemBlocks();
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar12,iVar2);
        iVar2 = gen_int(iVar1,iVar2);
        piVar9 = &call_tests;
        if (iVar4 != 0) {
          if (iVar4 == 1) {
            piVar9 = (int *)0xffffffffffffffff;
          }
          else {
            piVar9 = (int *)0x0;
          }
        }
        xmlXIncludeProcessTreeFlagsData(in_RSI,iVar2,piVar9);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar12,(xmlNodePtr)in_RSI,nr_05);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar6 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXIncludeProcessTreeFlagsData",
                 (ulong)(uint)(iVar2 - iVar6));
          local_40 = local_40 + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar7;
        }
        pxVar7 = (xmlDocPtr)(ulong)(iVar4 + 1);
      }
      uVar10 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar11 = true;
  iVar1 = 0;
  while (bVar11) {
    for (uVar12 = 0; iVar2 = (int)in_RSI, uVar12 != 4; uVar12 = uVar12 + 1) {
      iVar4 = xmlMemBlocks();
      uVar5 = gen_int(uVar12,iVar2);
      in_RSI = (xmlDocPtr)(ulong)uVar5;
      xmlXIncludeSetFlags(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeSetFlags",(ulong)(uint)(iVar2 - iVar4));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        in_RSI = (xmlDocPtr)(ulong)uVar12;
        printf(" %d");
        putchar(10);
      }
    }
    bVar11 = false;
  }
  function_tests = function_tests + 1;
  iVar1 = local_54 + test_ret_1 + local_40 + local_3c + local_48 + local_50 + test_ret + iVar1;
  uVar12 = -(iVar3 - iVar1);
  if (iVar3 != iVar1) {
    printf("Module xinclude: %d errors\n",(ulong)uVar12);
  }
  return uVar12;
}

Assistant:

static int
test_xinclude(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xinclude : 9 of 13 functions ...\n");
    test_ret += test_xmlXIncludeGetLastError();
    test_ret += test_xmlXIncludeNewContext();
    test_ret += test_xmlXIncludeProcess();
    test_ret += test_xmlXIncludeProcessFlags();
    test_ret += test_xmlXIncludeProcessFlagsData();
    test_ret += test_xmlXIncludeProcessNode();
    test_ret += test_xmlXIncludeProcessTree();
    test_ret += test_xmlXIncludeProcessTreeFlags();
    test_ret += test_xmlXIncludeProcessTreeFlagsData();
    test_ret += test_xmlXIncludeSetErrorHandler();
    test_ret += test_xmlXIncludeSetFlags();
    test_ret += test_xmlXIncludeSetResourceLoader();

    if (test_ret != 0)
	printf("Module xinclude: %d errors\n", test_ret);
    return(test_ret);
}